

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall kratos::IfStmt::set_parent(IfStmt *this,IRNode *node)

{
  element_type *peVar1;
  element_type *peVar2;
  IRNode *node_local;
  IfStmt *this_local;
  
  Stmt::set_parent(&this->super_Stmt,node);
  peVar1 = std::
           __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->then_body_);
  (*(peVar1->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[7])(peVar1,this);
  peVar1 = std::
           __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->else_body_);
  (*(peVar1->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[7])(peVar1,this);
  peVar2 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->predicate_stmt_);
  (*(peVar2->super_Stmt).super_IRNode._vptr_IRNode[7])(peVar2,this);
  return;
}

Assistant:

void IfStmt::set_parent(IRNode *node) {
    Stmt::set_parent(node);
    then_body_->set_parent(this);
    else_body_->set_parent(this);
    predicate_stmt_->set_parent(this);
}